

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

int __thiscall asmjit::v1_14::String::truncate(String *this,char *__file,__off_t __length)

{
  size_t newSize_local;
  String *this_local;
  
  if ((byte)*this < 0x1f) {
    if (__file < (char *)(ulong)(byte)*this) {
      (this + 1)[(long)__file] = (String)0x0;
      *this = SUB81(__file,0);
    }
  }
  else if (__file < *(char **)(this + 8)) {
    __file[*(long *)(this + 0x18)] = '\0';
    *(char **)(this + 8) = __file;
  }
  return 0;
}

Assistant:

Error String::truncate(size_t newSize) noexcept {
  if (isLargeOrExternal()) {
    if (newSize < _large.size) {
      _large.data[newSize] = '\0';
      _large.size = newSize;
    }
  }
  else {
    if (newSize < _type) {
      _small.data[newSize] = '\0';
      _small.type = uint8_t(newSize);
    }
  }

  return kErrorOk;
}